

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<bool>::streamReconstructedExpression(UnaryExpr<bool> *this,ostream *os)

{
  ostream *in_RSI;
  bool *in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  Detail::stringify<bool>(in_stack_ffffffffffffffa8);
  std::operator<<(in_RSI,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }